

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void iadst16_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i alVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  byte bVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  __m256i in0;
  __m256i in1;
  longlong local_200;
  longlong lStack_1f8;
  longlong lStack_1f0;
  longlong lStack_1e8;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar16 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x168);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18._16_4_ = uVar1;
  auVar18._20_4_ = uVar1;
  auVar18._24_4_ = uVar1;
  auVar18._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 600);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar17._16_4_ = uVar1;
  auVar17._20_4_ = uVar1;
  auVar17._24_4_ = uVar1;
  auVar17._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x180);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x240);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x220);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar22._16_4_ = uVar1;
  auVar22._20_4_ = uVar1;
  auVar22._24_4_ = uVar1;
  auVar22._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x1a0);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar16 + 0x1e0);
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  auVar20._16_4_ = uVar1;
  auVar20._20_4_ = uVar1;
  auVar20._24_4_ = uVar1;
  auVar20._28_4_ = uVar1;
  iVar15 = 1 << ((char)bit - 1U & 0x1f);
  auVar21._4_4_ = iVar15;
  auVar21._0_4_ = iVar15;
  auVar21._8_4_ = iVar15;
  auVar21._12_4_ = iVar15;
  auVar21._16_4_ = iVar15;
  auVar21._20_4_ = iVar15;
  auVar21._24_4_ = iVar15;
  auVar21._28_4_ = iVar15;
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar17);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  alVar2 = (__m256i)vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar18);
  auVar17 = vpsubd_avx2(auVar21,auVar17);
  auVar3 = vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar24);
  auVar18 = vpmulld_avx2(auVar3,auVar25);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar17 = vpaddd_avx2(auVar18,auVar17);
  auVar19 = ZEXT416((uint)bit);
  auVar4 = vpsrad_avx2(auVar17,auVar19);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar25);
  auVar18 = vpmulld_avx2(auVar24,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  alVar5 = (__m256i)vpsrad_avx2(auVar17,auVar19);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar23);
  auVar18 = vpmulld_avx2(auVar3,auVar22);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar17 = vpaddd_avx2(auVar18,auVar17);
  auVar6 = vpsrad_avx2(auVar17,auVar19);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar22);
  auVar18 = vpmulld_avx2(auVar23,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  auVar7 = vpsrad_avx2(auVar17,auVar19);
  auVar17 = vpmulld_avx2(auVar4,auVar23);
  auVar18 = vpmulld_avx2((undefined1  [32])alVar5,auVar22);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar17 = vpaddd_avx2(auVar18,auVar17);
  auVar18 = vpmulld_avx2(auVar4,auVar22);
  auVar22 = vpmulld_avx2(auVar23,(undefined1  [32])alVar5);
  auVar18 = vpaddd_avx2(auVar18,auVar21);
  auVar11 = vpsubd_avx2(auVar18,auVar22);
  auVar18 = vpmulld_avx2((undefined1  [32])alVar2,auVar20);
  auVar23 = vpmulld_avx2(auVar3,auVar20);
  auVar18 = vpaddd_avx2(auVar18,auVar21);
  auVar22 = vpaddd_avx2(auVar23,auVar18);
  auVar12 = vpsubd_avx2(auVar18,auVar23);
  auVar18 = vpmulld_avx2(auVar6,auVar20);
  auVar24 = vpmulld_avx2(auVar7,auVar20);
  auVar18 = vpaddd_avx2(auVar18,auVar21);
  auVar23 = vpaddd_avx2(auVar18,auVar24);
  auVar13 = vpsubd_avx2(auVar18,auVar24);
  auVar18 = vpmulld_avx2(auVar4,auVar20);
  auVar18 = vpaddd_avx2(auVar18,auVar21);
  auVar25 = vpmulld_avx2((undefined1  [32])alVar5,auVar20);
  auVar24 = vpaddd_avx2(auVar18,auVar25);
  auVar18 = vpsubd_avx2(auVar18,auVar25);
  auVar19 = ZEXT416((uint)bit);
  in0 = (__m256i)vpsrad_avx2(auVar17,auVar19);
  auVar17 = vpmulld_avx2((undefined1  [32])in0,auVar20);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar25 = vpsrad_avx2(auVar11,auVar19);
  auVar11 = vpsrad_avx2(auVar22,auVar19);
  alVar8 = (__m256i)vpsrad_avx2(auVar12,auVar19);
  in1 = (__m256i)vpsrad_avx2(auVar23,auVar19);
  auVar23 = vpsrad_avx2(auVar13,auVar19);
  alVar9 = (__m256i)vpsrad_avx2(auVar24,auVar19);
  auVar24 = vpsrad_avx2(auVar18,auVar19);
  auVar22 = vpmulld_avx2(auVar25,auVar20);
  auVar18 = vpaddd_avx2(auVar17,auVar22);
  auVar18 = vpsrad_avx2(auVar18,ZEXT416((uint)bit));
  auVar17 = vpsubd_avx2(auVar17,auVar22);
  alVar10 = (__m256i)vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  if (do_cols == 0) {
    bVar14 = 10;
    if (10 < bd) {
      bVar14 = (byte)bd;
    }
    local_a0 = 0x20 << (bVar14 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    neg_shift_avx2(in0,in1,out,out + 1,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 2,out + 3,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 4,out + 5,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 6,out + 7,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 8,out + 9,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 10,out + 0xb,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 0xc,out + 0xd,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 0xe,out + 0xf,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
  }
  else {
    *out = alVar2;
    auVar17 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar4);
    out[1] = alVar2;
    out[2][0] = in0[0];
    out[2][1] = in0[1];
    out[2][2] = in0[2];
    out[2][3] = in0[3];
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar6);
    out[3] = alVar2;
    out[4][0] = in1[0];
    out[4][1] = in1[1];
    out[4][2] = in1[2];
    out[4][3] = in1[3];
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar18);
    out[5] = alVar2;
    out[6] = alVar9;
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar11);
    out[7] = alVar2;
    out[8] = alVar8;
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar24);
    out[9] = alVar2;
    out[10] = alVar10;
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar23);
    out[0xb] = alVar2;
    local_200 = auVar7._0_8_;
    lStack_1f8 = auVar7._8_8_;
    lStack_1f0 = auVar7._16_8_;
    lStack_1e8 = auVar7._24_8_;
    out[0xc][0] = local_200;
    out[0xc][1] = lStack_1f8;
    out[0xc][2] = lStack_1f0;
    out[0xc][3] = lStack_1e8;
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar25);
    out[0xd] = alVar2;
    out[0xe] = alVar5;
    alVar2 = (__m256i)vpsubd_avx2(auVar17,auVar3);
    out[0xf] = alVar2;
  }
  return;
}

Assistant:

static void iadst16_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i zero = _mm256_setzero_si256();
  __m256i v[16], x, y, temp1, temp2;

  // Calculate the column 0, 1, 2, 3
  {
    // stage 0
    // stage 1
    // stage 2
    x = _mm256_mullo_epi32(in[0], cospi62);
    v[0] = _mm256_add_epi32(x, rnding);
    v[0] = _mm256_srai_epi32(v[0], bit);

    x = _mm256_mullo_epi32(in[0], cospi2);
    v[1] = _mm256_sub_epi32(zero, x);
    v[1] = _mm256_add_epi32(v[1], rnding);
    v[1] = _mm256_srai_epi32(v[1], bit);

    // stage 3
    v[8] = v[0];
    v[9] = v[1];

    // stage 4
    temp1 = _mm256_mullo_epi32(v[8], cospi8);
    x = _mm256_mullo_epi32(v[9], cospi56);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[8], cospi56);
    x = _mm256_mullo_epi32(v[9], cospi8);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[8] = temp1;
    v[9] = temp2;

    // stage 5
    v[4] = v[0];
    v[5] = v[1];
    v[12] = v[8];
    v[13] = v[9];

    // stage 6
    temp1 = _mm256_mullo_epi32(v[4], cospi16);
    x = _mm256_mullo_epi32(v[5], cospi48);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[4], cospi48);
    x = _mm256_mullo_epi32(v[5], cospi16);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[4] = temp1;
    v[5] = temp2;

    temp1 = _mm256_mullo_epi32(v[12], cospi16);
    x = _mm256_mullo_epi32(v[13], cospi48);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[12], cospi48);
    x = _mm256_mullo_epi32(v[13], cospi16);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[12] = temp1;
    v[13] = temp2;

    // stage 7
    v[2] = v[0];
    v[3] = v[1];
    v[6] = v[4];
    v[7] = v[5];
    v[10] = v[8];
    v[11] = v[9];
    v[14] = v[12];
    v[15] = v[13];

    // stage 8
    y = _mm256_mullo_epi32(v[2], cospi32);
    x = _mm256_mullo_epi32(v[3], cospi32);
    v[2] = _mm256_add_epi32(y, x);
    v[2] = _mm256_add_epi32(v[2], rnding);
    v[2] = _mm256_srai_epi32(v[2], bit);

    v[3] = _mm256_sub_epi32(y, x);
    v[3] = _mm256_add_epi32(v[3], rnding);
    v[3] = _mm256_srai_epi32(v[3], bit);

    y = _mm256_mullo_epi32(v[6], cospi32);
    x = _mm256_mullo_epi32(v[7], cospi32);
    v[6] = _mm256_add_epi32(y, x);
    v[6] = _mm256_add_epi32(v[6], rnding);
    v[6] = _mm256_srai_epi32(v[6], bit);

    v[7] = _mm256_sub_epi32(y, x);
    v[7] = _mm256_add_epi32(v[7], rnding);
    v[7] = _mm256_srai_epi32(v[7], bit);

    y = _mm256_mullo_epi32(v[10], cospi32);
    x = _mm256_mullo_epi32(v[11], cospi32);
    v[10] = _mm256_add_epi32(y, x);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[11] = _mm256_sub_epi32(y, x);
    v[11] = _mm256_add_epi32(v[11], rnding);
    v[11] = _mm256_srai_epi32(v[11], bit);

    y = _mm256_mullo_epi32(v[14], cospi32);
    x = _mm256_mullo_epi32(v[15], cospi32);
    v[14] = _mm256_add_epi32(y, x);
    v[14] = _mm256_add_epi32(v[14], rnding);
    v[14] = _mm256_srai_epi32(v[14], bit);

    v[15] = _mm256_sub_epi32(y, x);
    v[15] = _mm256_add_epi32(v[15], rnding);
    v[15] = _mm256_srai_epi32(v[15], bit);

    // stage 9
    if (do_cols) {
      out[0] = v[0];
      out[1] = _mm256_sub_epi32(_mm256_setzero_si256(), v[8]);
      out[2] = v[12];
      out[3] = _mm256_sub_epi32(_mm256_setzero_si256(), v[4]);
      out[4] = v[6];
      out[5] = _mm256_sub_epi32(_mm256_setzero_si256(), v[14]);
      out[6] = v[10];
      out[7] = _mm256_sub_epi32(_mm256_setzero_si256(), v[2]);
      out[8] = v[3];
      out[9] = _mm256_sub_epi32(_mm256_setzero_si256(), v[11]);
      out[10] = v[15];
      out[11] = _mm256_sub_epi32(_mm256_setzero_si256(), v[7]);
      out[12] = v[5];
      out[13] = _mm256_sub_epi32(_mm256_setzero_si256(), v[13]);
      out[14] = v[9];
      out[15] = _mm256_sub_epi32(_mm256_setzero_si256(), v[1]);
    } else {
      const int log_range_out = AOMMAX(16, bd + 6);
      const __m256i clamp_lo_out =
          _mm256_set1_epi32(-(1 << (log_range_out - 1)));
      const __m256i clamp_hi_out =
          _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

      neg_shift_avx2(v[0], v[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
      neg_shift_avx2(v[12], v[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[6], v[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[10], v[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[3], v[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[15], v[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[5], v[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[9], v[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    }
  }
}